

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O3

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  undefined4 *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  undefined4 *puVar18;
  ulong uVar19;
  ulong uVar20;
  undefined4 *puVar21;
  undefined4 *puVar22;
  int _w;
  undefined4 *puVar23;
  int _h;
  ulong local_98;
  undefined4 *local_78;
  
  uVar1 = bottom_blob->c;
  iVar11 = this->stride;
  uVar9 = (long)bottom_blob->w / (long)iVar11;
  uVar10 = (long)bottom_blob->h / (long)iVar11;
  _w = (int)uVar9;
  _h = (int)uVar10;
  Mat::create(top_blob,_w,_h,uVar1 * iVar11 * iVar11,bottom_blob->elemsize,opt->blob_allocator);
  iVar11 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar1) {
      local_78 = (undefined4 *)bottom_blob->data;
      sVar4 = bottom_blob->elemsize;
      uVar2 = this->stride;
      lVar12 = (long)bottom_blob->w * sVar4;
      sVar5 = bottom_blob->cstep;
      local_98 = 0;
      do {
        if (0 < (int)uVar2) {
          iVar11 = this->mode;
          pvVar6 = top_blob->data;
          sVar7 = top_blob->cstep;
          sVar8 = top_blob->elemsize;
          uVar19 = 0;
          puVar22 = local_78;
          do {
            iVar3 = this->stride;
            uVar14 = 0;
            puVar21 = puVar22;
            do {
              if (0 < _h) {
                iVar17 = ((int)local_98 * uVar2 + (int)uVar19) * uVar2 + (int)uVar14;
                if (iVar11 != 0) {
                  iVar17 = (uVar2 * (int)uVar19 + (int)uVar14) * uVar1 + (int)local_98;
                }
                puVar23 = (undefined4 *)((long)iVar17 * sVar7 * sVar8 + (long)pvVar6);
                uVar20 = 0;
                puVar18 = puVar21;
                do {
                  uVar16 = uVar9 & 0xffffffff;
                  puVar13 = puVar18;
                  if (0 < _w) {
                    do {
                      *puVar23 = *puVar13;
                      puVar23 = puVar23 + 1;
                      puVar13 = puVar13 + iVar3;
                      uVar15 = (int)uVar16 - 1;
                      uVar16 = (ulong)uVar15;
                    } while (uVar15 != 0);
                  }
                  uVar20 = uVar20 + 1;
                  puVar18 = (undefined4 *)((long)puVar18 + lVar12 * iVar3);
                } while (uVar20 != (uVar10 & 0xffffffff));
              }
              uVar14 = uVar14 + 1;
              puVar21 = puVar21 + 1;
            } while (uVar14 != uVar2);
            uVar19 = uVar19 + 1;
            puVar22 = (undefined4 *)((long)puVar22 + lVar12);
          } while (uVar19 != uVar2);
        }
        local_98 = local_98 + 1;
        local_78 = (undefined4 *)((long)local_78 + sVar4 * sVar5);
      } while (local_98 != uVar1);
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                int p;
                if (mode == 0)
                    p = q * stride * stride + sh * stride + sw;
                else // if (mode == 1)
                    p = (sh * stride + sw) * channels + q;

                float* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i * stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}